

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

void __thiscall
LNodeEStmt::LNodeEStmt(LNodeEStmt *this,shared_ptr<LNode> *vars,shared_ptr<LNode> *expr)

{
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->vars).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             &vars->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LNodeEStmt(std::shared_ptr<LNode> vars, std::shared_ptr<LNode> expr) {
        this->vars = std::move(vars);
        this->expr = std::move(expr);
    }